

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbFunc.c
# Opt level: O2

char * Acb_DeriveOnePatchFunction
                 (Cnf_Dat_t *pCnf,int iTar,int nTargets,int nCoDivs,Vec_Int_t *vUsed,int fCisOnly)

{
  Vec_Str_t *p;
  Vec_Int_t *p_00;
  int iVar1;
  int iVar2;
  sat_solver *s;
  char *pcVar3;
  long lVar4;
  int iVar5;
  int Lit;
  lit local_44;
  Vec_Str_t *local_40;
  Vec_Int_t *local_38;
  
  local_38 = Vec_IntAlloc(vUsed->nSize + 1);
  local_40 = Vec_StrAlloc(0);
  iVar5 = pCnf->nVars - (vUsed->nSize + nTargets);
  s = sat_solver_new();
  sat_solver_setnvars(s,pCnf->nVars + 1);
  lVar4 = 0;
  while (lVar4 < pCnf->nClauses) {
    iVar1 = sat_solver_addclause(s,pCnf->pClauses[lVar4],pCnf->pClauses[lVar4 + 1]);
    lVar4 = lVar4 + 1;
    if (iVar1 == 0) {
      return (char *)0x0;
    }
  }
  local_44 = 2;
  iVar1 = sat_solver_addclause(s,&local_44,(lit *)&local_40);
  if (iVar1 != 0) {
    if (fCisOnly == 0) {
      for (iVar1 = 0; iVar1 < vUsed->nSize; iVar1 = iVar1 + 1) {
        iVar2 = Vec_IntEntry(vUsed,iVar1);
        Vec_IntWriteEntry(vUsed,iVar1,iVar2 + 2);
      }
    }
    else {
      for (iVar1 = 0; iVar1 < vUsed->nSize; iVar1 = iVar1 + 1) {
        iVar2 = Vec_IntEntry(vUsed,iVar1);
        Vec_IntWriteEntry(vUsed,iVar1,iVar2 + iVar5);
      }
    }
    p_00 = local_38;
    p = local_40;
    pcVar3 = Acb_EnumerateSatAssigns
                       (s,(iTar - nTargets) + pCnf->nVars,pCnf->nVars,vUsed,local_38,local_40);
    Vec_IntFree(p_00);
    Vec_StrFree(p);
    sat_solver_delete(s);
    if (pcVar3 != (char *)0x0) {
      if (fCisOnly != 0) {
        for (iVar1 = 0; iVar1 < vUsed->nSize; iVar1 = iVar1 + 1) {
          iVar2 = Vec_IntEntry(vUsed,iVar1);
          Vec_IntWriteEntry(vUsed,iVar1,iVar2 - iVar5);
        }
        return pcVar3;
      }
      for (iVar5 = 0; iVar5 < vUsed->nSize; iVar5 = iVar5 + 1) {
        iVar1 = Vec_IntEntry(vUsed,iVar5);
        Vec_IntWriteEntry(vUsed,iVar5,iVar1 + -2);
      }
      return pcVar3;
    }
  }
  return (char *)0x0;
}

Assistant:

char * Acb_DeriveOnePatchFunction( Cnf_Dat_t * pCnf, int iTar, int nTargets, int nCoDivs, Vec_Int_t * vUsed, int fCisOnly )
{
    char * pSop = NULL;
    Vec_Int_t * vTempLits = Vec_IntAlloc( Vec_IntSize(vUsed)+1 );
    Vec_Str_t * vTempSop = Vec_StrAlloc(0);
    int i, Lit;
    int iCiVarBeg = pCnf->nVars - nTargets - Vec_IntSize(vUsed);
    int iCoVarBeg = 1, Index;
    sat_solver * pSat = sat_solver_new(); 
    sat_solver_setnvars( pSat, pCnf->nVars + 1 );
    // add clauses
    for ( i = 0; i < pCnf->nClauses; i++ )
        if ( !sat_solver_addclause( pSat, pCnf->pClauses[i], pCnf->pClauses[i+1] ) )
            return NULL;
    // add output clause
    Lit = Abc_Var2Lit( iCoVarBeg, 0 );
    if ( !sat_solver_addclause( pSat, &Lit, &Lit+1 ) )
        return NULL;
    // remap vUsed to be in terms of divisor variables
    if ( fCisOnly )
    {
        Vec_IntForEachEntry( vUsed, Index, i )
            Vec_IntWriteEntry( vUsed, i, iCiVarBeg + Index );
    }
    else
    {
        Vec_IntForEachEntry( vUsed, Index, i )
            Vec_IntWriteEntry( vUsed, i, iCoVarBeg + 1 + Index );
    }
    // enumerate assignments for each target in terms of used divisors
    pSop = Acb_EnumerateSatAssigns( pSat, pCnf->nVars - nTargets + iTar, pCnf->nVars, vUsed, vTempLits, vTempSop );
    Vec_IntFree( vTempLits );
    Vec_StrFree( vTempSop );
    sat_solver_delete( pSat );
    if ( pSop == NULL )
        return NULL;
    //printf( "Function %d:\n%s", i, pSop );
    // remap vUsed to be in terms of original divisors
    if ( fCisOnly )
    {
        Vec_IntForEachEntry( vUsed, Index, i )
            Vec_IntWriteEntry( vUsed, i, Index - iCiVarBeg );
    }
    else
    {
        Vec_IntForEachEntry( vUsed, Index, i )
            Vec_IntWriteEntry( vUsed, i, Index - (iCoVarBeg + 1) );
    }
    return pSop;
}